

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::splitsliver(tetgenmesh *this,triface *slitet,double cosd,int chkencflag)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  triface *t;
  point pdVar6;
  point pdVar7;
  double dVar8;
  triface *local_1a0;
  int local_168;
  int local_164;
  int i;
  int n;
  int t1ver;
  int success;
  double midpt [3];
  double local_138;
  double smtpt [3];
  insertvertexflags ivf;
  optparameters opm;
  point steinerpt;
  point pb;
  point pa;
  triface *parytet;
  triface spintet;
  triface searchtet;
  triface *abtets;
  int chkencflag_local;
  double cosd_local;
  triface *slitet_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&parytet);
  optparameters::optparameters((optparameters *)&ivf.parentpt);
  insertvertexflags::insertvertexflags((insertvertexflags *)(smtpt + 2));
  edestoppo(this,slitet,(triface *)&spintet.ver);
  if ((*(long *)(spintet._8_8_ + 0x40) == 0) ||
     (*(long *)(*(long *)(spintet._8_8_ + 0x40) + (long)ver2edge[(int)searchtet.tet] * 8) == 0)) {
    triface::operator=((triface *)&parytet,(triface *)&spintet.ver);
    local_164 = 0;
    do {
      bVar2 = ishulltet(this,(triface *)&parytet);
      iVar3 = (int)spintet.tet;
      if (bVar2) break;
      local_164 = local_164 + 1;
      decode(this,(tetrahedron)(&parytet->tet)[facepivot1[(int)spintet.tet]],(triface *)&parytet);
      spintet.tet._0_4_ = facepivot2[iVar3][(int)spintet.tet];
    } while (parytet != (triface *)spintet._8_8_);
    bVar2 = ishulltet(this,(triface *)&parytet);
    if (bVar2) {
      this_local._4_4_ = 0;
    }
    else {
      uVar4 = (ulong)local_164;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      t = (triface *)operator_new__(uVar5);
      if (uVar4 != 0) {
        local_1a0 = t;
        do {
          triface::triface(local_1a0);
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != t + uVar4);
      }
      triface::operator=((triface *)&parytet,(triface *)&spintet.ver);
      for (local_168 = 0; local_168 < local_164; local_168 = local_168 + 1) {
        triface::operator=(t + local_168,(triface *)&parytet);
        iVar3 = (int)spintet.tet;
        decode(this,(tetrahedron)(&parytet->tet)[facepivot1[(int)spintet.tet]],(triface *)&parytet);
        spintet.tet._0_4_ = facepivot2[iVar3][(int)spintet.tet];
      }
      for (local_168 = 0; local_168 < local_164; local_168 = local_168 + 1) {
        eprev(this,t + local_168,(triface *)&spintet.ver);
        esymself(this,(triface *)&spintet.ver);
        arraypool::newindex(this->cavetetlist,&pa);
        triface::operator=((triface *)pa,(triface *)&spintet.ver);
        enext(this,t + local_168,(triface *)&spintet.ver);
        esymself(this,(triface *)&spintet.ver);
        arraypool::newindex(this->cavetetlist,&pa);
        triface::operator=((triface *)pa,(triface *)&spintet.ver);
      }
      pdVar6 = org(this,t);
      pdVar7 = dest(this,t);
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        dVar8 = (pdVar6[local_168] + pdVar7[local_168]) * 0.5;
        *(double *)(&t1ver + (long)local_168 * 2) = dVar8;
        smtpt[(long)local_168 + -1] = dVar8;
      }
      opm.max_min_volume = 1;
      opm._8_8_ = cosd + 1.0;
      opm.imprval._0_4_ = 0x14;
      opm.numofsearchdirs = -0x2d0e5604;
      opm._36_4_ = 0x3f50624d;
      opm.searchstep._0_4_ = 100;
      iVar3 = smoothpoint(this,&local_138,this->cavetetlist,1,(optparameters *)&ivf.parentpt);
      if (iVar3 != 0) {
        while (opm.searchstep._4_4_ == opm.searchstep._0_4_) {
          opm._32_8_ = (double)opm._32_8_ * 10.0;
          opm._8_8_ = opm.initval;
          opm.searchstep._4_4_ = 0;
          smoothpoint(this,&local_138,this->cavetetlist,1,(optparameters *)&ivf.parentpt);
        }
      }
      arraypool::restart(this->cavetetlist);
      if (iVar3 == 0) {
        if (t != (triface *)0x0) {
          operator_delete__(t);
        }
        this_local._4_4_ = 0;
      }
      else {
        makepoint(this,(point *)&opm.maxiter,FREEVOLVERTEX);
        for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
          *(double *)(opm._48_8_ + (long)local_168 * 8) = smtpt[(long)local_168 + -1];
        }
        for (local_168 = 0; local_168 < local_164; local_168 = local_168 + 1) {
          infect(this,t + local_168);
          arraypool::newindex(this->caveoldtetlist,&pa);
          triface::operator=((triface *)pa,t + local_168);
        }
        triface::operator=((triface *)&spintet.ver,t);
        if (this->b->metric != 0) {
          locate(this,(point)opm._48_8_,(triface *)&spintet.ver,0);
        }
        if (t != (triface *)0x0) {
          operator_delete__(t);
        }
        smtpt[2]._0_4_ = 0xb;
        ivf.chkencflag = this->b->metric;
        ivf.respectbdflag = chkencflag;
        iVar3 = insertpoint(this,(point)opm._48_8_,(triface *)&spintet.ver,(face *)0x0,(face *)0x0,
                            (insertvertexflags *)(smtpt + 2));
        if (iVar3 == 0) {
          pointdealloc(this,(point)opm._48_8_);
          this_local._4_4_ = 0;
        }
        else {
          this->st_volref_count = this->st_volref_count + 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
          this_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::splitsliver(triface *slitet, REAL cosd, int chkencflag)
{
  triface *abtets;
  triface searchtet, spintet, *parytet;
  point pa, pb, steinerpt;
  optparameters opm;
  insertvertexflags ivf;
  REAL smtpt[3], midpt[3];
  int success;
  int t1ver;
  int n, i;

  // 'slitet' is [c,d,a,b], where [c,d] has a big dihedral angle. 
  // Go to the opposite edge [a,b].
  edestoppo(*slitet, searchtet); // [a,b,c,d].

  // Do not split a segment.
  if (issubseg(searchtet)) {
    return 0; 
  }

  // Count the number of tets shared at [a,b].
  // Do not split it if it is a hull edge.
  spintet = searchtet;
  n = 0; 
  while (1) {
    if (ishulltet(spintet)) break;
    n++;
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  }
  if (ishulltet(spintet)) {
    return 0; // It is a hull edge.
  }

  // Get all tets at edge [a,b].
  abtets = new triface[n];
  spintet = searchtet;
  for (i = 0; i < n; i++) {
    abtets[i] = spintet;
    fnextself(spintet);
  }

  // Initialize the list of 2n boundary faces.
  for (i = 0; i < n; i++) {    
    eprev(abtets[i], searchtet);
    esymself(searchtet); // [a,p_i,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
    enext(abtets[i], searchtet);
    esymself(searchtet); // [p_i,b,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
  }

  // Init the Steiner point at the midpoint of edge [a,b].
  pa = org(abtets[0]);
  pb = dest(abtets[0]);
  for (i = 0; i < 3; i++) {
    smtpt[i] = midpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  // Point smooth options.
  opm.min_max_dihedangle = 1;
  opm.initval = cosd + 1.0; // Initial volume is zero.
  opm.numofsearchdirs = 20;
  opm.searchstep = 0.001;  
  opm.maxiter = 100; // Limit the maximum iterations.

  success = smoothpoint(smtpt, cavetetlist, 1, &opm);

  if (success) {
    while (opm.smthiter == opm.maxiter) {
      // It was relocated and the prescribed maximum iteration reached. 
      // Try to increase the search stepsize.
      opm.searchstep *= 10.0;
      //opm.maxiter = 100; // Limit the maximum iterations.
      opm.initval = opm.imprval;
      opm.smthiter = 0; // Init.
      smoothpoint(smtpt, cavetetlist, 1, &opm);  
    }
  } // if (success)

  cavetetlist->restart();

  if (!success) {
    delete [] abtets;
    return 0;
  }


  // Insert the Steiner point.
  makepoint(&steinerpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) steinerpt[i] = smtpt[i];

  // Insert the created Steiner point.
  for (i = 0; i < n; i++) {
    infect(abtets[i]);
    caveoldtetlist->newindex((void **) &parytet);
    *parytet = abtets[i];
  }

  searchtet = abtets[0]; // No need point location.
  if (b->metric) {
    locate(steinerpt, &searchtet); // For size interpolation.
  }

  delete [] abtets;

  ivf.iloc = (int) INSTAR;
  ivf.chkencflag = chkencflag;
  ivf.assignmeshsize = b->metric; 


  if (insertpoint(steinerpt, &searchtet, NULL, NULL, &ivf)) {
    // The vertex has been inserted.
    st_volref_count++; 
    if (steinerleft > 0) steinerleft--;
    return 1;
  } else {
    // The Steiner point is too close to an existing vertex. Reject it.
    pointdealloc(steinerpt);
    return 0;
  }
}